

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O0

size_t __thiscall
helics::apps::AsioBrokerServer::tcpDataReceive
          (AsioBrokerServer *this,shared_ptr<gmlc::networking::TcpConnection> *connection,char *data
          ,size_t bytes_received)

{
  bool bVar1;
  action_t aVar2;
  size_t sVar3;
  element_type *this_00;
  ulong in_RCX;
  size_t __n;
  void *__buf;
  ActionMessage *in_RDI;
  int in_R8D;
  system_error *anon_var_0;
  ActionMessage rep;
  size_t used;
  ActionMessage m;
  size_t used_total;
  ActionMessage *command;
  undefined1 local_1d0 [8];
  ActionMessage *in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  CoreType in_stack_fffffffffffffe4c;
  ActionMessage *in_stack_fffffffffffffe50;
  ActionMessage *in_stack_fffffffffffffe58;
  int local_f8;
  ActionMessage local_e0;
  ulong local_28;
  ulong local_20;
  
  local_28 = 0;
  local_20 = in_RCX;
  do {
    if (local_20 <= local_28) {
      return local_28;
    }
    command = &local_e0;
    ActionMessage::ActionMessage(in_RDI);
    sVar3 = ActionMessage::depacketize
                      (in_stack_fffffffffffffe50,
                       (void *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                       in_stack_fffffffffffffe40);
    if (sVar3 == 0) {
      local_f8 = 3;
    }
    else {
      bVar1 = isProtocolCommand(command);
      if (bVar1) {
        __n = 6;
        TypedBrokerServer::generateMessageResponse
                  (in_stack_fffffffffffffe58,(portData *)in_stack_fffffffffffffe50,
                   in_stack_fffffffffffffe4c);
        aVar2 = ActionMessage::action((ActionMessage *)&stack0xfffffffffffffe50);
        if (aVar2 != cmd_ignore) {
          this_00 = CLI::std::
                    __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x202191);
          ActionMessage::packetize_abi_cxx11_(in_stack_fffffffffffffe38);
          gmlc::networking::TcpConnection::send(this_00,(int)local_1d0,__buf,__n,in_R8D);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)command);
        }
        ActionMessage::~ActionMessage(command);
      }
      local_28 = sVar3 + local_28;
      local_f8 = 0;
    }
    ActionMessage::~ActionMessage(command);
  } while (local_f8 == 0);
  return local_28;
}

Assistant:

std::size_t AsioBrokerServer::tcpDataReceive(
        const std::shared_ptr<gmlc::networking::TcpConnection>& connection,
        const char* data,
        std::size_t bytes_received)
    {
        std::size_t used_total = 0;
        while (used_total < bytes_received) {
            ActionMessage m;
            auto used =
                m.depacketize(data + used_total, static_cast<int>(bytes_received - used_total));
            if (used == 0) {
                break;
            }
            if (isProtocolCommand(m)) {
                // if the reply is not ignored respond with it otherwise
                // forward the original message on to the receiver to handle
                auto rep = generateMessageResponse(m, tcpPortData, CoreType::TCP);
                if (rep.action() != CMD_IGNORE) {
                    try {
                        connection->send(rep.packetize());
                    }
                    catch (const std::system_error&) {
                    }
                }
            }
            used_total += used;
        }

        return used_total;
    }